

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O1

void __thiscall IR::IRBuilder::save(IRBuilder *this,Temp *target)

{
  BasicBlock *pBVar1;
  pointer ppSVar2;
  Function *pFVar3;
  int iVar4;
  _Fwd_list_node_base *p_Var5;
  _Fwd_list_node_base *local_20;
  
  pBVar1 = this->block_;
  ppSVar2 = (pBVar1->super_vector<IR::Stmt_*,_std::allocator<IR::Stmt_*>_>).
            super__Vector_base<IR::Stmt_*,_std::allocator<IR::Stmt_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if ((((pBVar1->super_vector<IR::Stmt_*,_std::allocator<IR::Stmt_*>_>).
        super__Vector_base<IR::Stmt_*,_std::allocator<IR::Stmt_*>_>._M_impl.super__Vector_impl_data.
        _M_start != ppSVar2) && (iVar4 = (*ppSVar2[-1]->_vptr_Stmt[3])(), (char)iVar4 != '\0')) &&
     ((pBVar1->super_vector<IR::Stmt_*,_std::allocator<IR::Stmt_*>_>).
      super__Vector_base<IR::Stmt_*,_std::allocator<IR::Stmt_*>_>._M_impl.super__Vector_impl_data.
      _M_finish[-1] != (Stmt *)0x0)) {
    return;
  }
  pFVar3 = this->function_;
  p_Var5 = (_Fwd_list_node_base *)operator_new(0x18);
  p_Var5->_M_next = (_Fwd_list_node_base *)0x0;
  p_Var5[2]._M_next = (_Fwd_list_node_base *)target;
  p_Var5[1]._M_next = (_Fwd_list_node_base *)&PTR__Stmt_00138260;
  p_Var5->_M_next =
       (pFVar3->saves_).super__Fwd_list_base<IR::Save,_std::allocator<IR::Save>_>._M_impl._M_head.
       _M_next;
  (pFVar3->saves_).super__Fwd_list_base<IR::Save,_std::allocator<IR::Save>_>._M_impl._M_head._M_next
       = p_Var5;
  local_20 = (this->function_->saves_).super__Fwd_list_base<IR::Save,_std::allocator<IR::Save>_>.
             _M_impl._M_head._M_next + 1;
  std::vector<IR::Stmt*,std::allocator<IR::Stmt*>>::emplace_back<IR::Stmt*>
            ((vector<IR::Stmt*,std::allocator<IR::Stmt*>> *)this->block_,(Stmt **)&local_20);
  return;
}

Assistant:

void IRBuilder::save(const Temp* target) {
  if (block_->isTerminated()) return;
  function_->saves_.emplace_front(target);
  block_->push_back(&function_->saves_.front());
}